

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::TraverseSchema::attWildCardIntersection
          (TraverseSchema *this,SchemaAttDef *resultWildCard,SchemaAttDef *compareWildCard)

{
  AttTypes AVar1;
  AttTypes AVar2;
  uint uVar3;
  uint uVar4;
  ValueVectorOf<unsigned_int> *pVVar5;
  XMLSize_t XVar6;
  ValueVectorOf<unsigned_int> *this_00;
  QName *pQVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  undefined4 extraout_var;
  uint *puVar12;
  undefined4 extraout_var_00;
  XMLSize_t i;
  XMLSize_t XVar13;
  SchemaAttDef *pSVar14;
  SchemaAttDef *pSVar15;
  XMLSize_t i_1;
  bool bVar16;
  uint nameURI;
  uint local_6c;
  SchemaAttDef *local_68;
  size_t local_60;
  ValueVectorOf<unsigned_int> local_58;
  
  AVar1 = (resultWildCard->super_XMLAttDef).fType;
  AVar2 = (compareWildCard->super_XMLAttDef).fType;
  if (AVar1 != AttTypes_Unknown && AVar2 != Any_Any) {
    if (AVar1 == Any_Any || AVar2 == AttTypes_Unknown) {
      pVVar5 = resultWildCard->fNamespaceList;
      if ((pVVar5 != (ValueVectorOf<unsigned_int> *)0x0) && (pVVar5->fCurCount != 0)) {
        pVVar5->fCurCount = 0;
      }
      resultWildCard->fAttName->fURIId = compareWildCard->fAttName->fURIId;
      (resultWildCard->super_XMLAttDef).fType = AVar2;
      (resultWildCard->super_XMLAttDef).fDefaultType =
           (compareWildCard->super_XMLAttDef).fDefaultType;
    }
    else {
      bVar10 = (AVar1 ^ Any_List) != AttTypes_Min;
      bVar8 = (AVar2 ^ Any_Other) != AttTypes_Min;
      pSVar14 = compareWildCard;
      pSVar15 = resultWildCard;
      if (bVar10 || bVar8) {
        pSVar14 = resultWildCard;
        pSVar15 = compareWildCard;
        if ((AVar1 ^ Any_Other) != AttTypes_Min || (AVar2 ^ Any_List) != AttTypes_Min) {
          if ((AVar1 ^ Any_List) == AttTypes_Min && (AVar2 ^ Any_List) == AttTypes_Min) {
            pVVar5 = resultWildCard->fNamespaceList;
            this_00 = compareWildCard->fNamespaceList;
            if ((this_00 != (ValueVectorOf<unsigned_int> *)0x0) &&
               (XVar6 = this_00->fCurCount, XVar6 != 0)) {
              local_58.fMemoryManager = this->fGrammarPoolMemoryManager;
              local_58.fCallDestructor = false;
              local_58.fCurCount = 0;
              local_58.fMaxCount = XVar6;
              iVar11 = (*(local_58.fMemoryManager)->_vptr_MemoryManager[3])();
              local_58.fElemList = (uint *)CONCAT44(extraout_var_00,iVar11);
              memset(local_58.fElemList,0,XVar6 * 4);
              for (XVar13 = 0; XVar6 != XVar13; XVar13 = XVar13 + 1) {
                puVar12 = ValueVectorOf<unsigned_int>::elementAt(this_00,XVar13);
                local_6c = *puVar12;
                if ((pVVar5 != (ValueVectorOf<unsigned_int> *)0x0) &&
                   (bVar10 = ValueVectorOf<unsigned_int>::containsElement(pVVar5,&local_6c,0),
                   bVar10)) {
                  ValueVectorOf<unsigned_int>::addElement(&local_58,&local_6c);
                }
              }
              SchemaAttDef::setNamespaceList(resultWildCard,&local_58);
              ValueVectorOf<unsigned_int>::~ValueVectorOf(&local_58);
              return;
            }
            if (pVVar5 == (ValueVectorOf<unsigned_int> *)0x0) {
              return;
            }
            if (pVVar5->fCurCount == 0) {
              return;
            }
            pVVar5->fCurCount = 0;
            return;
          }
          if ((AVar1 ^ Any_Other) != AttTypes_Min || (AVar2 ^ Any_Other) != AttTypes_Min) {
            return;
          }
          pQVar7 = resultWildCard->fAttName;
          uVar3 = compareWildCard->fAttName->fURIId;
          if (pQVar7->fURIId == uVar3) {
            return;
          }
          uVar4 = this->fEmptyNamespaceURI;
          if (pQVar7->fURIId == uVar4) {
            pQVar7->fURIId = uVar3;
            return;
          }
          if (uVar3 == uVar4) {
            return;
          }
          pQVar7->fURIId = uVar4;
          (resultWildCard->super_XMLAttDef).fType = AttTypes_Unknown;
          return;
        }
      }
      pVVar5 = pSVar15->fNamespaceList;
      if ((pVVar5 != (ValueVectorOf<unsigned_int> *)0x0) && (XVar6 = pVVar5->fCurCount, XVar6 != 0))
      {
        uVar3 = pSVar14->fAttName->fURIId;
        local_58.fMemoryManager = this->fGrammarPoolMemoryManager;
        local_58.fCallDestructor = false;
        local_58.fCurCount = 0;
        local_60 = XVar6 * 4;
        local_68 = compareWildCard;
        local_58.fMaxCount = XVar6;
        iVar11 = (*(local_58.fMemoryManager)->_vptr_MemoryManager[3])();
        local_58.fElemList = (uint *)CONCAT44(extraout_var,iVar11);
        memset(local_58.fElemList,0,local_60);
        bVar16 = false;
        for (XVar13 = 0; XVar6 != XVar13; XVar13 = XVar13 + 1) {
          puVar12 = ValueVectorOf<unsigned_int>::elementAt(pVVar5,XVar13);
          local_6c = *puVar12;
          bVar9 = true;
          if ((local_6c != uVar3) && (local_6c != this->fEmptyNamespaceURI)) {
            ValueVectorOf<unsigned_int>::addElement(&local_58,&local_6c);
            bVar9 = bVar16;
          }
          bVar16 = bVar9;
        }
        if (bVar16 || (bVar10 || bVar8)) {
          SchemaAttDef::setNamespaceList(resultWildCard,&local_58);
        }
        ValueVectorOf<unsigned_int>::~ValueVectorOf(&local_58);
        compareWildCard = local_68;
      }
      if (bVar10 || bVar8) {
        resultWildCard->fAttName->fURIId = compareWildCard->fAttName->fURIId;
        AVar1 = (compareWildCard->super_XMLAttDef).fType;
        (resultWildCard->super_XMLAttDef).fDefaultType =
             (compareWildCard->super_XMLAttDef).fDefaultType;
        (resultWildCard->super_XMLAttDef).fType = AVar1;
      }
    }
  }
  return;
}

Assistant:

void
TraverseSchema::attWildCardIntersection(SchemaAttDef* const resultWildCard,
                                        const SchemaAttDef* const compareWildCard) {

    XMLAttDef::AttTypes typeR = resultWildCard->getType();
    XMLAttDef::AttTypes typeC = compareWildCard->getType();

    //If either O1 or O2 is any, then the other must be the value.
    if (typeC == XMLAttDef::Any_Any ||
        typeR == XMLAttDef::AttTypes_Unknown) {
        return;
    }

    if (typeR == XMLAttDef::Any_Any ||
        typeC == XMLAttDef::AttTypes_Unknown) {

        resultWildCard->resetNamespaceList();
        copyWildCardData(compareWildCard, resultWildCard);
        return;
    }

    // If either O1 or O2 is a pair of not and a namespace name and the other
    // is a set, then that set, minus the negated namespace name if it was in
    // is the value
    if ((typeC == XMLAttDef::Any_Other && typeR == XMLAttDef::Any_List) ||
        (typeR == XMLAttDef::Any_Other && typeC == XMLAttDef::Any_List)) {

        unsigned int compareURI = 0;
        ValueVectorOf<unsigned int>* nameURIList = 0;

        if (typeC == XMLAttDef::Any_List) {
            nameURIList = compareWildCard->getNamespaceList();
            compareURI = resultWildCard->getAttName()->getURI();
        }
        else {
            nameURIList = resultWildCard->getNamespaceList();
            compareURI = compareWildCard->getAttName()->getURI();
        }

        XMLSize_t listSize = (nameURIList) ? nameURIList->size() : 0;

        if (listSize) {

            bool                        found = false;
            ValueVectorOf<unsigned int> tmpURIList(listSize, fGrammarPoolMemoryManager);

            for (XMLSize_t i=0; i < listSize; i++) {

                unsigned int nameURI = nameURIList->elementAt(i);

                if (nameURI != compareURI &&
                    nameURI != (unsigned int) fEmptyNamespaceURI) {
                    tmpURIList.addElement(nameURI);
                }
                else {
                    found = true;
                }
            }

            if (found || typeC == XMLAttDef::Any_List) {
                resultWildCard->setNamespaceList(&tmpURIList);
            }
        }

        if (typeC == XMLAttDef::Any_List) {
            copyWildCardData(compareWildCard, resultWildCard);
        }

        return;
    }

    // If both O1 and O2 are sets, then the intersection of those sets must be
    // the value.
    if (typeR == XMLAttDef::Any_List && typeC == XMLAttDef::Any_List) {

        ValueVectorOf<unsigned int>* uriListR = resultWildCard->getNamespaceList();
        ValueVectorOf<unsigned int>* uriListC = compareWildCard->getNamespaceList();
        XMLSize_t listSize = (uriListC) ? uriListC->size() : 0;

        if (listSize) {

            ValueVectorOf<unsigned int> tmpURIList(listSize, fGrammarPoolMemoryManager);

            for (XMLSize_t i=0; i < listSize; i++) {

                unsigned int uriName = uriListC->elementAt(i);

                if (uriListR && uriListR->containsElement(uriName)) {
                    tmpURIList.addElement(uriName);
                }
            }

            resultWildCard->setNamespaceList(&tmpURIList);
        }
        else {
            resultWildCard->resetNamespaceList();
        }

        return;
    }

    // If the two are negations of different namespace names, then:
    //  if one is a negation of absent, then result is negation of namespace
    //  else intersection is not expressible.
    if (typeR == XMLAttDef::Any_Other && typeC == XMLAttDef::Any_Other) {

        QName* qnameR = resultWildCard->getAttName();

        if (qnameR->getURI() != compareWildCard->getAttName()->getURI()) {

            if (qnameR->getURI() == (unsigned int)fEmptyNamespaceURI) {
                qnameR->setURI(compareWildCard->getAttName()->getURI());
            }
            else if (compareWildCard->getAttName()->getURI() != (unsigned int)fEmptyNamespaceURI) {

                qnameR->setURI(fEmptyNamespaceURI);
                resultWildCard->setType(XMLAttDef::AttTypes_Unknown);
            }
        }
    }
}